

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription
          (SubpassDescription *this,VkPipelineBindPoint _pipelineBindPoint,
          VkSubpassDescriptionFlags _flags,deUint32 _inputAttachmentCount,
          VkAttachmentReference *_inputAttachments,deUint32 _colorAttachmentCount,
          VkAttachmentReference *_colorAttachments,VkAttachmentReference *_resolveAttachments,
          VkAttachmentReference depthStencilAttachment,deUint32 _preserveAttachmentCount,
          deUint32 *_preserveAttachments)

{
  VkAttachmentReference *__last;
  VkAttachmentReference *__first;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  allocator<unsigned_int> local_b9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  allocator<vk::VkAttachmentReference> local_99;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_98;
  allocator<vk::VkAttachmentReference> local_79;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_78;
  allocator<vk::VkAttachmentReference> local_49;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_48;
  deUint32 local_2c;
  VkAttachmentReference *pVStack_28;
  deUint32 _colorAttachmentCount_local;
  VkAttachmentReference *_inputAttachments_local;
  VkSubpassDescriptionFlags local_18;
  deUint32 _inputAttachmentCount_local;
  VkSubpassDescriptionFlags _flags_local;
  VkPipelineBindPoint _pipelineBindPoint_local;
  SubpassDescription *this_local;
  
  local_2c = _colorAttachmentCount;
  pVStack_28 = _inputAttachments;
  _inputAttachments_local._4_4_ = _inputAttachmentCount;
  local_18 = _flags;
  _inputAttachmentCount_local = _pipelineBindPoint;
  __flags_local = this;
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_inputAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_colorAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_resolveAttachments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_preserveAttachments);
  __first = pVStack_28;
  __last = pVStack_28 + _inputAttachments_local._4_4_;
  std::allocator<vk::VkAttachmentReference>::allocator(&local_49);
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_48,__first,__last,&local_49);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_inputAttachments,&local_48);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            (&local_48);
  std::allocator<vk::VkAttachmentReference>::~allocator(&local_49);
  uVar4 = (ulong)local_2c;
  std::allocator<vk::VkAttachmentReference>::allocator(&local_79);
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_78,_colorAttachments,_colorAttachments + uVar4,&local_79);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_colorAttachments,&local_78);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            (&local_78);
  std::allocator<vk::VkAttachmentReference>::~allocator(&local_79);
  if (_resolveAttachments != (VkAttachmentReference *)0x0) {
    uVar4 = (ulong)local_2c;
    std::allocator<vk::VkAttachmentReference>::allocator(&local_99);
    std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
    vector<vk::VkAttachmentReference_const*,void>
              ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
               &local_98,_resolveAttachments,_resolveAttachments + uVar4,&local_99);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
              (&this->m_resolveAttachments,&local_98);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
              (&local_98);
    std::allocator<vk::VkAttachmentReference>::~allocator(&local_99);
  }
  std::allocator<unsigned_int>::allocator(&local_b9);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b8,_preserveAttachments,
             _preserveAttachments + _preserveAttachmentCount,&local_b9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_preserveAttachments,&local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
  std::allocator<unsigned_int>::~allocator(&local_b9);
  this->m_depthStencilAttachment = depthStencilAttachment;
  (this->super_VkSubpassDescription).flags = local_18;
  (this->super_VkSubpassDescription).pipelineBindPoint = _inputAttachmentCount_local;
  (this->super_VkSubpassDescription).inputAttachmentCount = _inputAttachments_local._4_4_;
  (this->super_VkSubpassDescription).pInputAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).colorAttachmentCount = local_2c;
  (this->super_VkSubpassDescription).pColorAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pResolveAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  (this->super_VkSubpassDescription).pPreserveAttachments = (deUint32 *)0x0;
  (this->super_VkSubpassDescription).preserveAttachmentCount = _preserveAttachmentCount;
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_inputAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_inputAttachments,0);
    (this->super_VkSubpassDescription).pInputAttachments = pvVar2;
  }
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_colorAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_colorAttachments,0);
    (this->super_VkSubpassDescription).pColorAttachments = pvVar2;
  }
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_resolveAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_resolveAttachments,0);
    (this->super_VkSubpassDescription).pResolveAttachments = pvVar2;
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_preserveAttachments);
  if (!bVar1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_preserveAttachments,0);
    (this->super_VkSubpassDescription).pPreserveAttachments = pvVar3;
  }
  return;
}

Assistant:

SubpassDescription::SubpassDescription (vk::VkPipelineBindPoint				_pipelineBindPoint,
										vk::VkSubpassDescriptionFlags		_flags,
										deUint32							_inputAttachmentCount,
										const vk::VkAttachmentReference*	_inputAttachments,
										deUint32							_colorAttachmentCount,
										const vk::VkAttachmentReference*	_colorAttachments,
										const vk::VkAttachmentReference*	_resolveAttachments,
										vk::VkAttachmentReference			depthStencilAttachment,
										deUint32							_preserveAttachmentCount,
										const deUint32*						_preserveAttachments)
{
	m_inputAttachments = std::vector<vk::VkAttachmentReference>(_inputAttachments, _inputAttachments + _inputAttachmentCount);
	m_colorAttachments = std::vector<vk::VkAttachmentReference>(_colorAttachments, _colorAttachments + _colorAttachmentCount);

	if (_resolveAttachments)
		m_resolveAttachments = std::vector<vk::VkAttachmentReference>(_resolveAttachments, _resolveAttachments + _colorAttachmentCount);

	m_preserveAttachments = std::vector<deUint32>(_preserveAttachments, _preserveAttachments + _preserveAttachmentCount);

	m_depthStencilAttachment = depthStencilAttachment;

	flags					= _flags;
	pipelineBindPoint		= _pipelineBindPoint;
	inputAttachmentCount	= _inputAttachmentCount;
	pInputAttachments		= DE_NULL;
	colorAttachmentCount	= _colorAttachmentCount;
	pColorAttachments		= DE_NULL;
	pResolveAttachments		= DE_NULL;
	pDepthStencilAttachment	= &m_depthStencilAttachment;
	pPreserveAttachments	= DE_NULL;
	preserveAttachmentCount	= _preserveAttachmentCount;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];
}